

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O0

void pzshape::TPZShapePrism::SideShape
               (int side,TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,
               TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  TPZVec<double> *in_RCX;
  int in_EDI;
  TPZVec<long> *in_R8;
  TPZVec<int> *in_R9;
  TPZFMatrix<double> *in_stack_00000a60;
  TPZFMatrix<double> *in_stack_00000a68;
  TPZVec<int> *in_stack_00000a70;
  TPZVec<long> *in_stack_00000a78;
  TPZVec<double> *in_stack_00000a80;
  TPZFMatrix<double> *in_stack_00000f50;
  TPZFMatrix<double> *in_stack_00000f58;
  TPZVec<int> *in_stack_00000f60;
  TPZVec<long> *in_stack_00000f68;
  TPZVec<double> *in_stack_00000f70;
  TPZFMatrix<double> *in_stack_00001390;
  TPZFMatrix<double> *in_stack_00001398;
  TPZVec<int> *in_stack_000013a0;
  TPZVec<long> *in_stack_000013a8;
  TPZVec<double> *in_stack_000013b0;
  TPZFMatrix<double> *in_stack_00001750;
  TPZFMatrix<double> *in_stack_00001758;
  TPZVec<int> *in_stack_00001760;
  TPZVec<long> *in_stack_00001768;
  TPZVec<double> *in_stack_00001770;
  TPZFMatrix<double> *in_stack_ffffffffffffffc8;
  
  if ((in_EDI < 0) || (0x14 < in_EDI)) {
    std::operator<<((ostream *)&std::cerr,"TPZCompElPr3d::SideShapeFunction. Bad paramenter side.\n"
                   );
  }
  else if (in_EDI == 0x14) {
    Shape(in_stack_00001770,in_stack_00001768,in_stack_00001760,in_stack_00001758,in_stack_00001750)
    ;
  }
  else if (in_EDI < 6) {
    TPZShapePoint::Shape
              (in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,(TPZFMatrix<double> *)0x188c896);
  }
  else if (in_EDI < 0xf) {
    TPZShapeLinear::Shape
              (in_stack_00000a80,in_stack_00000a78,in_stack_00000a70,in_stack_00000a68,
               in_stack_00000a60);
  }
  else if ((in_EDI == 0xf) || (in_EDI == 0x13)) {
    TPZShapeTriang::Shape
              (in_stack_000013b0,in_stack_000013a8,in_stack_000013a0,in_stack_00001398,
               in_stack_00001390);
  }
  else {
    TPZShapeQuad::Shape(in_stack_00000f70,in_stack_00000f68,in_stack_00000f60,in_stack_00000f58,
                        in_stack_00000f50);
  }
  return;
}

Assistant:

void TPZShapePrism::SideShape(int side, TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		if(side<0 || side>20) PZError << "TPZCompElPr3d::SideShapeFunction. Bad paramenter side.\n";
		else if(side==20) {
			Shape(pt,id,order,phi,dphi);
		} else if(side<6) {
			TPZShapePoint::Shape(pt,id,order,phi,dphi);
		} else if(side < 15) {
			TPZShapeLinear::Shape(pt,id,order,phi,dphi);
		} else if(side == 15 || side == 19) {
			TPZShapeTriang::Shape(pt,id,order,phi,dphi);
		} else {
			TPZShapeQuad::Shape(pt,id,order,phi,dphi);
		}
	}